

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

aiMatrix4x4 * Assimp::FBX::ReadMatrix(aiMatrix4x4 *__return_storage_ptr__,Element *element)

{
  size_type sVar1;
  reference pvVar2;
  allocator<char> local_59;
  string local_58;
  undefined1 local_28 [8];
  vector<float,_std::allocator<float>_> values;
  Element *element_local;
  
  values.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)element;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  ParseVectorDataArray
            ((vector<float,_std::allocator<float>_> *)local_28,
             (Element *)
             values.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  sVar1 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_28);
  if (sVar1 != 0x10) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"expected 16 matrix elements",&local_59);
    anon_unknown.dwarf_d3af7e::ParseError(&local_58,(Element *)0x0);
  }
  aiMatrix4x4t<float>::aiMatrix4x4t(__return_storage_ptr__);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0);
  __return_storage_ptr__->a1 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,1);
  __return_storage_ptr__->a2 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,2);
  __return_storage_ptr__->a3 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,3);
  __return_storage_ptr__->a4 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,4);
  __return_storage_ptr__->b1 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,5);
  __return_storage_ptr__->b2 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,6);
  __return_storage_ptr__->b3 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,7);
  __return_storage_ptr__->b4 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,8);
  __return_storage_ptr__->c1 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,9);
  __return_storage_ptr__->c2 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,10);
  __return_storage_ptr__->c3 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xb);
  __return_storage_ptr__->c4 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xc);
  __return_storage_ptr__->d1 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xd);
  __return_storage_ptr__->d2 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xe);
  __return_storage_ptr__->d3 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xf);
  __return_storage_ptr__->d4 = *pvVar2;
  aiMatrix4x4t<float>::Transpose(__return_storage_ptr__);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 ReadMatrix(const Element& element)
{
    std::vector<float> values;
    ParseVectorDataArray(values,element);

    if(values.size() != 16) {
        ParseError("expected 16 matrix elements");
    }

    aiMatrix4x4 result;


    result.a1 = values[0];
    result.a2 = values[1];
    result.a3 = values[2];
    result.a4 = values[3];

    result.b1 = values[4];
    result.b2 = values[5];
    result.b3 = values[6];
    result.b4 = values[7];

    result.c1 = values[8];
    result.c2 = values[9];
    result.c3 = values[10];
    result.c4 = values[11];

    result.d1 = values[12];
    result.d2 = values[13];
    result.d3 = values[14];
    result.d4 = values[15];

    result.Transpose();
    return result;
}